

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::declare_constant_arrays(CompilerMSL *this)

{
  uint id;
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  bool bVar3;
  SPIRConstant *c;
  SPIRType *type;
  undefined8 uVar4;
  long lVar5;
  allocator local_f1;
  ulong local_f0;
  LoopLock local_e8;
  size_t local_e0;
  ParsedIR *local_d8;
  string local_d0;
  string name;
  string local_90;
  string local_70;
  string local_50;
  
  local_d8 = &(this->super_CompilerGLSL).super_Compiler.ir;
  local_e0 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[4].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  ParsedIR::create_loop_hard_lock(local_d8);
  pTVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  lVar5 = 0;
  local_f0 = 0;
  do {
    if (sVar2 << 2 == lVar5) {
      ParsedIR::LoopLock::~LoopLock(&local_e8);
      if ((local_f0 & 1) != 0) {
        CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x272bdf);
      }
      return;
    }
    id = *(uint *)((long)&pTVar1->id + lVar5);
    if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [id].type == TypeConstant) {
      c = ParsedIR::get<spirv_cross::SPIRConstant>(local_d8,id);
      if (c->specialization == false) {
        type = Compiler::get<spirv_cross::SPIRType>
                         ((Compiler *)this,*(uint32_t *)&(c->super_IVariant).field_0xc);
        bVar3 = Compiler::is_array((Compiler *)this,type);
        if (bVar3) {
          if (local_e0 == 1) {
            bVar3 = Compiler::is_scalar((Compiler *)this,type);
            if (!bVar3) {
              bVar3 = Compiler::is_vector((Compiler *)this,type);
              if (!bVar3) goto LAB_001de05e;
            }
          }
          CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(c->super_IVariant).self.id);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&name,this,(ulong)(c->super_IVariant).self.id,1);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])(&local_d0,this,type);
          ::std::__cxx11::string::string((string *)&local_90,"constant",&local_f1);
          inject_top_level_storage_qualifier(&local_70,&local_d0,&local_90);
          CompilerGLSL::constant_expression_abi_cxx11_
                    (&local_50,&this->super_CompilerGLSL,c,false,false);
          CompilerGLSL::
          statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,&local_70,(char (*) [4])0x297dc7,&local_50,
                     (char (*) [2])0x297c5b);
          ::std::__cxx11::string::~string((string *)&local_50);
          ::std::__cxx11::string::~string((string *)&local_70);
          ::std::__cxx11::string::~string((string *)&local_90);
          ::std::__cxx11::string::~string((string *)&local_d0);
          uVar4 = ::std::__cxx11::string::~string((string *)&name);
          local_f0 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
        }
      }
    }
LAB_001de05e:
    lVar5 = lVar5 + 4;
  } while( true );
}

Assistant:

void CompilerMSL::declare_constant_arrays()
{
	bool fully_inlined = ir.ids_for_type[TypeFunction].size() == 1;

	// MSL cannot declare arrays inline (except when declaring a variable), so we must move them out to
	// global constants directly, so we are able to use constants as variable expressions.
	bool emitted = false;

	ir.for_each_typed_id<SPIRConstant>([&](uint32_t, SPIRConstant &c) {
		if (c.specialization)
			return;

		auto &type = this->get<SPIRType>(c.constant_type);
		// Constant arrays of non-primitive types (i.e. matrices) won't link properly into Metal libraries.
		// FIXME: However, hoisting constants to main() means we need to pass down constant arrays to leaf functions if they are used there.
		// If there are multiple functions in the module, drop this case to avoid breaking use cases which do not need to
		// link into Metal libraries. This is hacky.
		if (is_array(type) && (!fully_inlined || is_scalar(type) || is_vector(type)))
		{
			add_resource_name(c.self);
			auto name = to_name(c.self);
			statement(inject_top_level_storage_qualifier(variable_decl(type, name), "constant"),
			          " = ", constant_expression(c), ";");
			emitted = true;
		}
	});

	if (emitted)
		statement("");
}